

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin-ratelimit.hh
# Opt level: O2

void __thiscall
discordpp::
PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
::do_some_work(PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
               *this)

{
  long lVar1;
  element_type *__args_1;
  uint __line;
  __type_conflict1 _Var2;
  size_type sVar3;
  mapped_type *__lhs;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  size_t sVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Rb_tree_node_base *p_Var10;
  char *__assertion;
  ulong uVar11;
  long lVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  route_t next_route;
  _Rb_tree_node_base *local_1b0;
  ulong local_1a8;
  _Rb_tree_node_base *local_1a0;
  CountedSet<unsigned_long> *local_198;
  key_type_conflict *local_190;
  value_type info;
  anon_class_32_3_d47dc058 local_168;
  __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
  local_148;
  __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
  local_138;
  anon_class_32_3_d47dc058 local_128;
  __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
  local_108;
  _Function_base local_f8;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:69:30)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:69:30)>
             ::_M_manager;
  discordpp::log::log((log *)0x0,0.0);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if (((this->
       super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
       ).
       super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
       .field_0xfd == '\0') &&
     ((this->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0x168 != '\x01')) {
    (this->
    super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
    ).
    super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
    .field_0xfd = 1;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:80:30)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:80:30)>
               ::_M_manager;
    discordpp::log::log((log *)0x0,0.0);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    next_route = 0;
    uVar11 = (ulong)*(int *)&(this->
                             super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                             ).
                             super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                             .field_0xf8;
    p_Var5 = *(_Rb_tree_node_base **)
              &(this->
               super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
               ).field_0x1c0;
    local_1b0 = (_Rb_tree_node_base *)
                &(this->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                 .field_0x178;
    local_190 = (key_type_conflict *)
                &(this->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).field_0x1d8;
    local_198 = (CountedSet<unsigned_long> *)
                &(this->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                 .field_0x130;
    lVar12 = 0x7fffffffffffffff;
    local_1a0 = (_Rb_tree_node_base *)0x0;
    p_Var10 = (_Rb_tree_node_base *)0x0;
    for (; p_Var5 != (_Rb_tree_node_base *)
                     &(this->
                      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                      ).
                      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                      .field_0x1b0; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5))
    {
      sVar3 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_1b0,local_190);
      if (sVar3 == 0) {
LAB_0016ebfb:
        p_Var8 = (_Base_ptr)((long)&(p_Var5[4]._M_left)->_M_color + local_198->sum);
        uVar9 = (long)p_Var5[6]._M_left - (long)p_Var8;
        if (uVar9 < uVar11) {
          uVar11 = uVar9;
        }
        if (p_Var8 < p_Var5[6]._M_left) {
          local_1a8 = uVar11;
          for (p_Var4 = p_Var5[3]._M_right; uVar11 = local_1a8,
              p_Var4 != (_Rb_tree_node_base *)&p_Var5[3]._M_parent;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            if (p_Var4[2]._M_right == p_Var4[1]._M_right) {
              __assertion = "!qe.second.empty() && \"Encountered an empty queue in a bucket\"";
              __line = 0x66;
              goto LAB_0016ef59;
            }
            lVar1 = *(long *)(*(long *)p_Var4[1]._M_right + 0x18);
            if (lVar1 < lVar12) {
              next_route = *(route_t *)(p_Var4 + 1);
              p_Var10 = p_Var5 + 2;
              lVar12 = lVar1;
              local_1a0 = p_Var5 + 3;
            }
          }
        }
      }
      else {
        __lhs = std::
                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_1b0,local_190);
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var5 + 2));
        if ((!_Var2) || (p_Var5[4]._M_parent != (_Base_ptr)0x0)) goto LAB_0016ebfb;
      }
    }
    local_1b0 = (_Rb_tree_node_base *)
                &(this->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                 .field_0x100;
    local_1a8 = uVar11;
    for (p_Var5 = *(_Rb_tree_node_base **)
                   &(this->
                    super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                    ).
                    super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                    .field_0x118;
        p_Var5 != (_Rb_tree_node_base *)
                  &(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0x108; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (p_Var5[2]._M_right == p_Var5[1]._M_right) {
        __assertion = "!qe.second.empty() && \"Encountered an empty global queue\"";
        __line = 0x73;
LAB_0016ef59:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh"
                      ,__line,
                      "void discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work() [BASE = discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>]"
                     );
      }
      lVar1 = *(long *)(*(long *)p_Var5[1]._M_right + 0x18);
      if ((lVar1 < lVar12) ||
         ((((this->
            super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
            ).
            super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
            .field_0xfc == '\x01' && (p_Var10 != (_Rb_tree_node_base *)0x0)) &&
          (sVar6 = CountedSet<unsigned_long>::count(local_198,*(unsigned_long *)(p_Var5 + 1)),
          sVar6 == 0)))) {
        next_route = *(route_t *)(p_Var5 + 1);
        local_1a0 = local_1b0;
        p_Var10 = (_Rb_tree_node_base *)0x0;
        lVar12 = lVar1;
      }
    }
    if ((p_Var10 == (_Rb_tree_node_base *)0x0) &&
       ((*(long *)&(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0x128 == 0 || (local_1a8 == 0)))) {
      local_b8._M_unused._M_object = (void *)0x0;
      local_b8._8_8_ = 0;
      local_a0 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:132:22)>
                 ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:132:22)>
                 ::_M_manager;
      discordpp::log::log((log *)0x0,0.0);
      std::_Function_base::~_Function_base((_Function_base *)&local_b8);
      (this->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0xfd = 0;
    }
    else {
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      local_c0 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:137:30)>
                 ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:137:30)>
                 ::_M_manager;
      discordpp::log::log((log *)0x0,0.0);
      std::_Function_base::~_Function_base((_Function_base *)&local_d8);
      p_Var5 = local_1a0;
      iVar7 = std::_Rb_tree<$e4f3d558$>::find((_Rb_tree<_e4f3d558_> *)local_1a0,&next_route);
      std::
      __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&info.
                      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                     ,(__shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                       *)iVar7._M_node[1]._M_right);
      std::
      deque<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::allocator<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>_>_>
      ::pop_front((deque<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::allocator<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>_>_>
                   *)&iVar7._M_node[1]._M_parent);
      if (iVar7._M_node[2]._M_right == iVar7._M_node[1]._M_right) {
        std::_Rb_tree<$e4f3d558$>::erase((_Rb_tree<_e4f3d558_> *)p_Var5,&next_route);
      }
      std::
      __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_148,
                     &info.
                      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::function<void(std::ostream*)>::
      function<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work()::_lambda(std::ostream*)_6_,void>
                ((function<void(std::ostream*)> *)&local_f8,(anon_class_16_1_898d11ac *)&local_148);
      discordpp::log::log((log *)0x0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      std::_Function_base::~_Function_base(&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
      __args_1 = ((info.
                   super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->call).
                 super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_148._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)next_route;
      local_148._M_ptr = (element_type *)this;
      std::
      __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_138,
                     &info.
                      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      make_shared<std::function<void(bool)>const,discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work()::_lambda(bool)_1_>
                (&local_168);
      local_128.info.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)next_route;
      local_128.info.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)this;
      std::
      __shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_108,
                     &info.
                      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      make_shared<std::function<void(bool,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>const,discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work()::_lambda(bool,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)_1_>
                (&local_128);
      std::
      make_shared<discordpp::BotStruct::RenderedCall,std::shared_ptr<std::__cxx11::string_const>const&,std::shared_ptr<std::__cxx11::string_const>const&,std::shared_ptr<std::__cxx11::string_const>const&,std::shared_ptr<std::__cxx11::string_const>const&,std::shared_ptr<std::function<void(bool)>const>,std::shared_ptr<std::function<void(bool,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>const>>
                ((shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_168.info,&__args_1->method,&__args_1->target,&__args_1->type,
                 (shared_ptr<const_std::function<void_(bool)>_> *)&__args_1->body,
                 (shared_ptr<const_std::function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
                  *)&local_168);
      RestSimpleWeb<discordpp::Bot>::doCall
                ((RestSimpleWeb<discordpp::Bot> *)this,(sptr<RenderedCall> *)&local_168.info);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_168.info.
                  super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128.route);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168.route);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&info.
                  super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  else {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:75:22)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:75:22)>
               ::_M_manager;
    discordpp::log::log((log *)0x0,0.0);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
  }
  return;
}

Assistant:

void do_some_work() {
        log::log(log::trace, [](std::ostream *log) {
            *log << "Check about doing work...";
        });
        // If already looping don't start a new loop
        if (writing || blocked) {
            log::log(log::trace,
                     [](std::ostream *log) { *log << " Not now."; });
            return;
        }
        writing = true;

        log::log(log::trace, [](std::ostream *log) { *log << " Can work..."; });

        // Find queue that needs to be sent next
        Bucket *next_bucket = nullptr;
        QueueByRoute *next_queues = nullptr;
        route_t next_route = 0;
        std::size_t min_remaining = defaultLimit;
        std::time_t min = std::numeric_limits<std::time_t>::max();
        for (auto &be : buckets) {
            if (route_to_bucket.count(gateway_route) &&
                route_to_bucket[gateway_route] == be.second.id &&
                be.second.queues.empty())
                continue;
            min_remaining =
                std::min(min_remaining,
                         be.second.remaining -
                             (be.second.transit.total() + transit.total()));
            if (be.second.remaining <=
                be.second.transit.total() + transit.total())
                continue;
            for (auto &qe : be.second.queues) {
                assert(!qe.second.empty() &&
                       "Encountered an empty queue in a bucket");
                auto created = qe.second.front()->created;
                if (created < min) {
                    min = created;
                    next_bucket = &be.second;
                    next_queues = &be.second.queues;
                    next_route = qe.first;
                }
            }
        }

        // `queues` may be empty
        for (auto &qe : queues) {
            assert(!qe.second.empty() && "Encountered an empty global queue");
            auto created = qe.second.front()->created;
            if (created < min || (unknownFirst && next_bucket != nullptr &&
                                  !transit.count(qe.first))) {
                min = created;
                next_bucket = nullptr;
                next_queues = &queues;
                next_route = qe.first;
            }
        }

        // Can we send a message?
        // If we found a next bucket, yes.
        // If the uncategorized queue isn't empty and there's no chance of
        // overflowing a bucket, yes.
        if (!next_bucket && (queues.empty() || min_remaining <= 0)) {
            log::log(log::trace,
                     [](std::ostream *log) { *log << " Nothing to do."; });
            writing = false;
            return;
        }

        log::log(log::trace, [](std::ostream *log) { *log << " Queueing."; });

        // Get the next call and delete its queue if empty
        auto next_queue = next_queues->find(next_route);
        auto info = next_queue->second.front();
        next_queue->second.pop();
        if (next_queue->second.empty()) {
            next_queues->erase(next_route);
        }

        log::log(log::trace, [info](std::ostream *log) {
            *log << "Plugin: RateLimit: "
                 << "Sending " << *info->call->target;
            if (info->call != nullptr) {
                *log << ' ' << *info->call->target;
                if (info->call->body) {
                    *log << info->call->body;
                } else {
                    *log << " with no body";
                }
            }
            *log << '\n';
        });

        // Do the call
        // Note: We are binding raw pointers and we must guarantee their
        // lifetimes
        // Note: `BASE::doCall` is used directly here as `Call::run` would
        // result in an infinite loop
        BASE::doCall(std::make_shared<RenderedCall>(
            info->call->method, info->call->target, info->call->type,
            info->call->body,
            std::make_shared<const handleWrite>(
                [this, route = next_route,
                 info](bool error) { // When the call is sent
                    info->writeFailed = error;

                    if (!error) {
                        // Mark the message as counting against rate
                        // limits while in transit
                        (route_to_bucket.count(route)
                             ? buckets[route_to_bucket[route]].transit
                             : transit)
                            .insert(route);
                    }
                    writing = false;

                    // Check if the cycle continues
                    aioc->post([this] { do_some_work(); });

                    // Run the user's onWrite callback
                    if (info->call->onWrite != nullptr) {
                        (*info->call->onWrite)(error);
                    }
                }),
            std::make_shared<const handleRead>([this, route = next_route,
                                                info](bool error,
                                                      const json &
                                                          msg) { // When Discord
                                                                 // replies
                // Get the current bucket
                auto *bucket = (route_to_bucket.count(route)
                                    ? &buckets[route_to_bucket[route]]
                                    : nullptr);

                // This message is no longer in transit
                if (!info->writeFailed) {
                    (bucket ? bucket->transit : transit).erase(route);
                }

                if (msg.contains("header") &&
                    (!error || msg["result"].get<int>() == 429)) {
                    auto &headers = msg["header"];
                    { // Find the new bucket and transfer other messages
                      // with the same route
                        auto new_id =
                            headers["X-RateLimit-Bucket"].get<std::string>();
                        if (!bucket || bucket->id != new_id) {
                            auto *old_bucket = bucket;

                            route_to_bucket[route] = new_id;
                            bucket = &buckets.emplace(new_id, Bucket{new_id})
                                          .first->second;

                            log::log(log::trace, [old_bucket,
                                                  bucket](std::ostream *log) {
                                *log << "Migrating from "
                                     << (old_bucket ? old_bucket->id : "global")
                                     << " to " << bucket->id << '\n';
                            });

                            bucket->queues.insert(
                                (old_bucket ? old_bucket->queues : queues)
                                    .extract(route));
                            (old_bucket ? old_bucket->transit : transit)
                                .move(bucket->transit, route);
                        }
                    }

                    // If ratelimited
                    if (msg["result"].get<int>() == 429) {
                        if (msg["body"]["global"]) { // If global, block all
                                                     // messages
                            blocked = true;
                            reset.reset();
                            reset = std::make_unique<asio::steady_timer>(*aioc);
                            reset->expires_after(std::chrono::seconds(
                                msg["body"]["retry_after"].get<int>()));
                            reset->async_wait([this](const error_code &e) {
                                // Don't reset the limit if the timer is
                                // cancelled
                                if (e) {
                                    return;
                                }
                                log::log(log::trace, [](std::ostream *log) {
                                    *log << "Global rate limit has "
                                            "elapsed.\n";
                                });
                                // Reset the limit
                                blocked = false;
                                // Kickstart the message sending process
                                aioc->post([this] { do_some_work(); });
                            });
                        } else { // Otherwise block this bucket
                            bucket->remaining = 0;
                            bucket->reset.reset();
                            bucket->reset =
                                std::make_unique<asio::steady_timer>(*aioc);
                            bucket->reset->expires_after(std::chrono::seconds(
                                msg["body"]["retry_after"].get<int>()));
                            bucket->reset->async_wait(
                                [this, owner = bucket](const error_code &e) {
                                    // Don't reset the limit if the timer is
                                    // cancelled
                                    if (e) {
                                        return;
                                    }
                                    log::log(log::trace,
                                             [owner](std::ostream *log) {
                                                 *log << "Limit reset for "
                                                      << owner->id << '\n';
                                             });
                                    // Reset the limit
                                    owner->remaining = owner->limit;
                                    // Kickstart the message sending process
                                    aioc->post([this] { do_some_work(); });
                                });
                        }

                        // Requeue this call
                        doCall(info->call);

                        return;
                    }

                    // Set the buckets new limits
                    bucket->limit = stox<std::size_t>(
                        headers["X-RateLimit-Limit"].get<std::string>());
                    bucket->remaining = std::min(
                        bucket->remaining,
                        stox<std::size_t>(headers["X-RateLimit-Remaining"]
                                              .get<std::string>()));

                    // Set a time for expiration of said limits
                    bucket->reset.reset();
                    bucket->reset = std::make_unique<asio::steady_timer>(*aioc);
                    bucket->reset->expires_after(
                        std::chrono::milliseconds(std::stoi(std::regex_replace(
                            headers["X-RateLimit-Reset-After"]
                                .get<std::string>(),
                            std::regex(R"([\D])"), ""))));
                    bucket->reset->async_wait(
                        [this, owner = bucket](const error_code &e) {
                            // Don't reset the limit if the timer is
                            // cancelled
                            if (e) {
                                return;
                            }
                            log::log(log::trace, [owner](std::ostream *log) {
                                *log << "Limit reset for " << owner->id << '\n';
                            });
                            // Reset the limit
                            owner->remaining = owner->limit;
                            // Kickstart the message sending process
                            aioc->post([this] { do_some_work(); });
                        });
                }

                // Run the user's onRead callback
                if (info->call->onRead != nullptr) {
                    (*info->call->onRead)(error, msg);
                }
            })));
    }